

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

void __thiscall
Darts::Details::DoubleArrayBuilder::build_from_keyset<int>
          (DoubleArrayBuilder *this,Keyset<int> *keyset,size_t begin,size_t end,size_t depth,
          id_type dic_id)

{
  id_type iVar1;
  size_t *psVar2;
  byte bVar3;
  byte bVar4;
  ulong end_00;
  
  while( true ) {
    iVar1 = arrange_from_keyset<int>(this,keyset,begin,end,depth,dic_id);
    if (begin < end) {
      while (((keyset->lengths_ != (size_t *)0x0 && (keyset->lengths_[begin] <= depth)) ||
             (keyset->keys_[begin][depth] == '\0'))) {
        begin = begin + 1;
        if (end == begin) {
          return;
        }
      }
    }
    if (begin == end) break;
    psVar2 = keyset->lengths_;
    if ((psVar2 == (size_t *)0x0) || (depth < psVar2[begin])) {
      bVar3 = keyset->keys_[begin][depth];
    }
    else {
      bVar3 = 0;
    }
    end_00 = begin + 1;
    if (end_00 < end) {
      do {
        if ((psVar2 == (size_t *)0x0) || (depth < psVar2[end_00])) {
          bVar4 = keyset->keys_[end_00][depth];
        }
        else {
          bVar4 = 0;
        }
        if (bVar4 != bVar3) {
          build_from_keyset<int>(this,keyset,begin,end_00,depth + 1,bVar3 ^ iVar1);
          psVar2 = keyset->lengths_;
          begin = end_00;
          if ((psVar2 == (size_t *)0x0) || (depth < psVar2[end_00])) {
            bVar3 = keyset->keys_[end_00][depth];
          }
          else {
            bVar3 = 0;
          }
        }
        end_00 = end_00 + 1;
      } while (end != end_00);
    }
    dic_id = iVar1 ^ bVar3;
    depth = depth + 1;
  }
  return;
}

Assistant:

void DoubleArrayBuilder::build_from_keyset(const Keyset<T> &keyset,
    std::size_t begin, std::size_t end, std::size_t depth, id_type dic_id) {
  id_type offset = arrange_from_keyset(keyset, begin, end, depth, dic_id);

  while (begin < end) {
    if (keyset.keys(begin, depth) != '\0') {
      break;
    }
    ++begin;
  }
  if (begin == end) {
    return;
  }

  std::size_t last_begin = begin;
  uchar_type last_label = keyset.keys(begin, depth);
  while (++begin < end) {
    uchar_type label = keyset.keys(begin, depth);
    if (label != last_label) {
      build_from_keyset(keyset, last_begin, begin,
          depth + 1, offset ^ last_label);
      last_begin = begin;
      last_label = keyset.keys(begin, depth);
    }
  }
  build_from_keyset(keyset, last_begin, end, depth + 1, offset ^ last_label);
}